

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitStream.hpp
# Opt level: O0

char __thiscall rc::detail::BitStream<rc::Random>::next<char>(BitStream<rc::Random> *this,int nbits)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  Number NVar6;
  unsigned_long uVar7;
  Random *in_stack_ffffffffffffffb0;
  char signBit;
  unsigned_long bits;
  int local_28;
  int n;
  int wantBits;
  int iStack_1c;
  char value;
  BitStream<rc::Random> *pBStack_18;
  int nbits_local;
  BitStream<rc::Random> *this_local;
  
  iStack_1c = nbits;
  pBStack_18 = this;
  wantBits = numBits<char>();
  piVar5 = std::min<int>(&stack0xffffffffffffffe4,&wantBits);
  local_28 = *piVar5;
  if (local_28 == 0) {
    this_local._7_1_ = 0;
  }
  else {
    n._3_1_ = 0;
    iStack_1c = local_28;
    for (; 0 < local_28; local_28 = local_28 - iVar3) {
      if (this->m_numBits == 0) {
        NVar6 = Random::next(in_stack_ffffffffffffffb0);
        this->m_bits = NVar6;
        iVar3 = numBits<unsigned_long>();
        this->m_numBits = iVar3 + this->m_numBits;
      }
      piVar5 = std::min<int>(&this->m_numBits,&local_28);
      iVar3 = *piVar5;
      uVar1 = this->m_bits;
      uVar7 = bitMask<unsigned_long>(iVar3);
      n._3_1_ = n._3_1_ | (byte)((uVar1 & uVar7) << ((char)iStack_1c - (char)local_28 & 0x3fU));
      in_stack_ffffffffffffffb0 = (Random *)(long)iVar3;
      iVar4 = numBits<unsigned_long>();
      if (in_stack_ffffffffffffffb0 < (Random *)(long)iVar4) {
        this->m_bits = this->m_bits >> ((byte)iVar3 & 0x3f);
      }
      this->m_numBits = this->m_numBits - iVar3;
    }
    if ((n._3_1_ & (byte)(1 << ((char)iStack_1c - 1U & 0x1f))) != 0) {
      bVar2 = bitMask<char>(iStack_1c);
      n._3_1_ = n._3_1_ | bVar2 ^ 0xff;
    }
    this_local._7_1_ = n._3_1_;
  }
  return this_local._7_1_;
}

Assistant:

T BitStream<Source>::next(int nbits, std::false_type) {
  using SourceType = decltype(m_source.next());
  nbits = std::min(nbits, numBits<T>());

  if (nbits == 0) {
    return 0;
  }

  T value = 0;
  int wantBits = nbits;
  while (wantBits > 0) {
    // Out of bits, refill
    if (m_numBits == 0) {
      m_bits = m_source.next();
      m_numBits += numBits<SourceType>();
    }

    const auto n = std::min(m_numBits, wantBits);
    const auto bits = m_bits & bitMask<SourceType>(n);
    value |= (bits << (nbits - wantBits));
    // To avoid right-shifting data beyond the width of the given type (which is
    // undefined behavior, because of course it is) only perform this shift-
    // assignment if we have room.
    if (static_cast<SourceType>(n) <
        static_cast<SourceType>(numBits<SourceType>())) {
      m_bits >>= static_cast<SourceType>(n);
    }
    m_numBits -= n;
    wantBits -= n;
  }

  if (std::is_signed<T>::value) {
    T signBit = static_cast<T>(0x1) << static_cast<T>(nbits - 1);
    if ((value & signBit) != 0) {
      // For signed values, we use the last bit as the sign bit. Since this
      // was 1, mask away by setting all bits above this one to 1 to make it a
      // negative number in 2's complement
      value |= ~bitMask<T>(nbits);
    }
  }

  return value;
}